

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cradix.c
# Opt level: O3

void isort(uchar **a,int n,int d)

{
  uchar *puVar1;
  uchar *puVar2;
  bool bVar3;
  long lVar4;
  uchar **ppuVar5;
  byte bVar6;
  uchar **ppuVar7;
  byte bVar8;
  long lVar9;
  
  if (1 < n) {
    lVar4 = (long)d;
    ppuVar5 = a;
    do {
      ppuVar5 = ppuVar5 + 1;
      if (a < ppuVar5) {
        puVar1 = *ppuVar5;
        ppuVar7 = ppuVar5;
        do {
          puVar2 = ppuVar7[-1];
          bVar8 = puVar2[lVar4];
          bVar6 = puVar1[lVar4];
          if ((bVar8 != 0) && (lVar9 = lVar4, bVar8 == bVar6)) {
            do {
              lVar9 = lVar9 + 1;
              bVar8 = puVar2[lVar9];
              bVar6 = puVar1[lVar9];
              if (bVar8 == 0) break;
            } while (bVar8 == bVar6);
          }
          if (bVar8 <= bVar6) break;
          *ppuVar7 = puVar2;
          ppuVar7[-1] = puVar1;
          ppuVar7 = ppuVar7 + -1;
        } while (a < ppuVar7);
      }
      bVar3 = 2 < n;
      n = n + -1;
    } while (bVar3);
  }
  return;
}

Assistant:

static
void isort(unsigned char **a, int n, int d)
{
	unsigned char **pi, **pj, *s, *t;
	for (pi = a + 1; --n > 0; pi++)
		for (pj = pi; pj > a; pj--) {
			for (s=*(pj-1)+d, t=*pj+d;
					*s==*t && *s!=0; s++, t++) ;
			if (*s <= *t) break;
			t = *(pj); *(pj) = *(pj-1);
			*(pj-1) = t;
		}
}